

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_geometry_device.cpp
# Opt level: O0

void device_init(char *cfg)

{
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  RTCScene in_stack_ffffffffffffff30;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined4 local_ac;
  undefined4 local_a8;
  undefined4 local_a4;
  undefined8 *local_a0;
  undefined4 local_94;
  undefined4 local_90;
  undefined4 local_8c;
  undefined8 *local_88;
  undefined4 local_7c;
  undefined4 local_78;
  undefined4 local_74;
  undefined1 *local_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined4 local_58;
  undefined4 local_54;
  undefined4 local_50;
  undefined4 local_4c;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined4 local_38;
  undefined4 local_34;
  undefined4 local_30;
  undefined4 local_2c;
  Vec3fa *pos;
  RTCGeometryType gtype;
  RTCScene in_stack_ffffffffffffffe8;
  
  embree::TutorialData_Constructor((TutorialData *)0x12adc8);
  embree::g_scene = rtcNewScene(g_device);
  embree::data = embree::g_scene;
  embree::addGroundPlane(in_stack_ffffffffffffff30);
  local_a0 = &local_c8;
  local_a4 = 0;
  local_a8 = 0;
  local_ac = 0;
  pos = (Vec3fa *)0x0;
  gtype = RTC_GEOMETRY_TYPE_TRIANGLE;
  local_c8 = 0;
  uStack_c0 = 0;
  embree::addPoints(in_stack_ffffffffffffffe8,RTC_GEOMETRY_TYPE_TRIANGLE,(Vec3fa *)0x0);
  local_88 = &local_d8;
  local_8c = 0x40a00000;
  local_90 = 0;
  local_94 = 0;
  local_2c = 0;
  local_30 = 0;
  local_34 = 0;
  local_38 = 0x40a00000;
  local_48 = 0x40a00000;
  uStack_40 = 0;
  local_d8 = 0x40a00000;
  embree::addPoints(in_stack_ffffffffffffffe8,gtype,pos);
  local_74 = 0xc0a00000;
  local_78 = 0;
  local_7c = 0;
  local_4c = 0;
  local_50 = 0;
  local_54 = 0;
  local_58 = 0xc0a00000;
  local_68 = 0xc0a00000;
  uStack_60 = 0;
  local_e8 = 0xc0a00000;
  uStack_e0 = 0;
  local_70 = (undefined1 *)&local_e8;
  embree::addPoints(in_stack_ffffffffffffffe8,gtype,pos);
  rtcCommitScene(embree::g_scene);
  _DAT_006043e0 = rtcGetSceneTraversable(embree::data);
  return;
}

Assistant:

void device_init (char* cfg)
{
  /* create scene */
  TutorialData_Constructor(&data);
  g_scene = data.g_scene = rtcNewScene(g_device);

  /* add ground plane */
  addGroundPlane(g_scene);

  /* add curve */
  addPoints(g_scene, RTC_GEOMETRY_TYPE_SPHERE_POINT,        Vec3fa( 0.0f, 0.0f, 0.0f));
  addPoints(g_scene, RTC_GEOMETRY_TYPE_DISC_POINT,          Vec3fa( 5.0f, 0.0f, 0.0f));
  addPoints(g_scene, RTC_GEOMETRY_TYPE_ORIENTED_DISC_POINT, Vec3fa(-5.0f, 0.0f, 0.0f));

  /* commit changes to scene */
  rtcCommitScene (g_scene);
  data.g_traversable = rtcGetSceneTraversable(data.g_scene);
}